

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O0

ssize_t file_read_asciiz(FILE *stream,char *buffer,size_t size)

{
  int iVar1;
  uint local_2c;
  int c;
  uint i;
  size_t size_local;
  char *buffer_local;
  FILE *stream_local;
  
  for (local_2c = 0; local_2c < size; local_2c = local_2c + 1) {
    if ((ulong)local_2c == size - 1) {
      return -1;
    }
    iVar1 = getc_unlocked((FILE *)stream);
    if (iVar1 == -1) {
      return -1;
    }
    buffer[local_2c] = (char)iVar1;
    if (iVar1 == 0) break;
  }
  return (ulong)(local_2c + 1);
}

Assistant:

ssize_t
file_read_asciiz(
    FILE* stream,
    char* buffer,
    size_t size)
{
    unsigned int i;
    int c;
    for (i = 0; i < size; ++i) {
        if (i == size - 1) {
            return -1;
        }
        c = getc_unlocked(stream);
        if (c == EOF) {
            return -1;
        }
        buffer[i] = c;
        if (!c)
            break;
    }
    return i + 1;
}